

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O2

void __thiscall Vertex::mutateVertex(Vertex *this)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  int i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  string temp_seq;
  
  std::__cxx11::string::string((string *)&temp_seq,(string *)&this->seq);
  if (this->treshhold < 6) {
    bVar9 = false;
    for (iVar3 = 0; iVar3 < (int)(this->seq)._M_string_length; iVar3 = iVar3 + 1) {
      iVar4 = this->quality;
      piVar2 = (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (ulong)((long)(this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      uVar5 = 0xffffffff;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        if (bVar9) goto LAB_001025f6;
        iVar7 = piVar2[uVar8];
        if (iVar7 < iVar4) {
          piVar2[uVar8] = 100;
          uVar5 = uVar8 & 0xffffffff;
          iVar4 = iVar7;
        }
      }
      if (bVar9) break;
      bVar9 = (int)uVar5 != -1;
      if (bVar9) {
        temp_seq._M_dataplus._M_p[(int)uVar5] = 'X';
      }
    }
  }
  else {
    iVar3 = 0;
    for (iVar4 = 0; iVar4 < (int)(this->seq)._M_string_length; iVar4 = iVar4 + 1) {
      iVar7 = this->quality;
      piVar2 = (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (ulong)((long)(this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      uVar5 = 0xffffffff;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        if (iVar3 == 2) goto LAB_001025f6;
        iVar1 = piVar2[uVar8];
        if (iVar1 < iVar7) {
          piVar2[uVar8] = 100;
          uVar5 = uVar8 & 0xffffffff;
          iVar7 = iVar1;
        }
      }
      if (iVar3 == 2) break;
      if ((int)uVar5 != -1) {
        temp_seq._M_dataplus._M_p[(int)uVar5] = 'X';
        iVar3 = iVar3 + 1;
      }
    }
  }
LAB_001025f6:
  std::__cxx11::string::_M_assign((string *)&this->seq_del);
  std::__cxx11::string::~string((string *)&temp_seq);
  return;
}

Assistant:

void Vertex::mutateVertex(){
    string temp_seq = this->seq;
    int min_index = 0, min = 0, count = 0;
    if(this->treshhold > 5){
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count == 2)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count == 2)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
        this->seq_del = temp_seq;
        return void();
    }else{
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
    }
    this->seq_del = temp_seq;
    return void();
}